

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::DataTypeCompare(ImGuiDataType data_type,void *arg_1,void *arg_2)

{
  double *in_RDX;
  double *in_RSI;
  undefined4 in_EDI;
  int local_4;
  
  switch(in_EDI) {
  case 0:
    local_4 = DataTypeCompareT<signed_char>((char *)in_RSI,(char *)in_RDX);
    break;
  case 1:
    local_4 = DataTypeCompareT<unsigned_char>((uchar *)in_RSI,(uchar *)in_RDX);
    break;
  case 2:
    local_4 = DataTypeCompareT<short>((short *)in_RSI,(short *)in_RDX);
    break;
  case 3:
    local_4 = DataTypeCompareT<unsigned_short>((unsigned_short *)in_RSI,(unsigned_short *)in_RDX);
    break;
  case 4:
    local_4 = DataTypeCompareT<int>((int *)in_RSI,(int *)in_RDX);
    break;
  case 5:
    local_4 = DataTypeCompareT<unsigned_int>((uint *)in_RSI,(uint *)in_RDX);
    break;
  case 6:
    local_4 = DataTypeCompareT<long_long>((longlong *)in_RSI,(longlong *)in_RDX);
    break;
  case 7:
    local_4 = DataTypeCompareT<unsigned_long_long>
                        ((unsigned_long_long *)in_RSI,(unsigned_long_long *)in_RDX);
    break;
  case 8:
    local_4 = DataTypeCompareT<float>((float *)in_RSI,(float *)in_RDX);
    break;
  case 9:
    local_4 = DataTypeCompareT<double>(in_RSI,in_RDX);
    break;
  case 10:
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ImGui::DataTypeCompare(ImGuiDataType data_type, const void* arg_1, const void* arg_2)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeCompareT<ImS8  >((const ImS8*  )arg_1, (const ImS8*  )arg_2);
    case ImGuiDataType_U8:     return DataTypeCompareT<ImU8  >((const ImU8*  )arg_1, (const ImU8*  )arg_2);
    case ImGuiDataType_S16:    return DataTypeCompareT<ImS16 >((const ImS16* )arg_1, (const ImS16* )arg_2);
    case ImGuiDataType_U16:    return DataTypeCompareT<ImU16 >((const ImU16* )arg_1, (const ImU16* )arg_2);
    case ImGuiDataType_S32:    return DataTypeCompareT<ImS32 >((const ImS32* )arg_1, (const ImS32* )arg_2);
    case ImGuiDataType_U32:    return DataTypeCompareT<ImU32 >((const ImU32* )arg_1, (const ImU32* )arg_2);
    case ImGuiDataType_S64:    return DataTypeCompareT<ImS64 >((const ImS64* )arg_1, (const ImS64* )arg_2);
    case ImGuiDataType_U64:    return DataTypeCompareT<ImU64 >((const ImU64* )arg_1, (const ImU64* )arg_2);
    case ImGuiDataType_Float:  return DataTypeCompareT<float >((const float* )arg_1, (const float* )arg_2);
    case ImGuiDataType_Double: return DataTypeCompareT<double>((const double*)arg_1, (const double*)arg_2);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return 0;
}